

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
* __thiscall
nlohmann::detail::
json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
::handle_value<long&>
          (json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
           *this,long *v)

{
  char cVar1;
  value_t vVar2;
  char *pcVar3;
  json_value jVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar5;
  undefined1 local_40 [8];
  json_value local_38;
  undefined1 local_30 [8];
  json_value local_28;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    local_28.number_integer = *v;
    local_30[0] = number_integer;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    pbVar5 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               **)this;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    vVar2 = pbVar5->m_type;
    pbVar5->m_type = local_30[0];
    jVar4 = pbVar5->m_value;
    (pbVar5->m_value).number_integer = (number_integer_t)local_28;
    local_30[0] = vVar2;
    local_28 = jVar4;
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant(pbVar5);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_30);
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_30 + 8),local_30[0]);
    pbVar5 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               **)this;
  }
  else {
    pcVar3 = *(char **)(*(long *)(this + 0x10) + -8);
    cVar1 = *pcVar3;
    if (cVar1 == '\x01') {
      if (*(long *)(this + 0x20) == 0) {
        __assert_fail("object_element",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                      ,0x120a,
                      "BasicJsonType *nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<>>::handle_value(Value &&) [BasicJsonType = nlohmann::basic_json<>, Value = long &]"
                     );
      }
      local_38.number_integer = *v;
      local_40[0] = number_integer;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_40);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_40);
      pbVar5 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)(this + 0x20);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_40);
      vVar2 = pbVar5->m_type;
      pbVar5->m_type = local_40[0];
      jVar4 = pbVar5->m_value;
      (pbVar5->m_value).number_integer = (number_integer_t)local_38;
      local_40[0] = vVar2;
      local_38 = jVar4;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant(pbVar5);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_40);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_40 + 8),local_40[0]);
      pbVar5 = *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)(this + 0x20);
    }
    else {
      if (cVar1 != '\x02') {
        __assert_fail("ref_stack.back()->is_array() or ref_stack.back()->is_object()",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/json/repo/single_include/nlohmann/json.hpp"
                      ,0x1201,
                      "BasicJsonType *nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<>>::handle_value(Value &&) [BasicJsonType = nlohmann::basic_json<>, Value = long &]"
                     );
      }
      std::
      vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
      ::emplace_back<long&>
                (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                   **)(pcVar3 + 8),v);
      pbVar5 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)(*(long *)(*(long *)(*(long *)(*(long *)(this + 0x10) + -8) + 8) + 8) + -0x10);
    }
  }
  return pbVar5;
}

Assistant:

JSON_HEDLEY_RETURNS_NON_NULL
    BasicJsonType* handle_value(Value&& v)
    {
        if (ref_stack.empty())
        {
            root = BasicJsonType(std::forward<Value>(v));
            return &root;
        }

        assert(ref_stack.back()->is_array() or ref_stack.back()->is_object());

        if (ref_stack.back()->is_array())
        {
            ref_stack.back()->m_value.array->emplace_back(std::forward<Value>(v));
            return &(ref_stack.back()->m_value.array->back());
        }

        assert(ref_stack.back()->is_object());
        assert(object_element);
        *object_element = BasicJsonType(std::forward<Value>(v));
        return object_element;
    }